

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRange.h
# Opt level: O2

size_t getJoinedLength<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                 (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *rng,string_view separator)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  pbVar2 = (rng->End)._M_current;
  lVar3 = 0;
  pbVar1 = (rng->Begin)._M_current;
  for (pbVar4 = pbVar1; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    lVar3 = lVar3 + pbVar4->_M_string_length;
  }
  return lVar3 + (((long)pbVar2 - (long)pbVar1 >> 5) + -1) * separator._M_len;
}

Assistant:

Iter end() const { return this->End; }